

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Segment::PreloadCluster(Segment *this,Cluster *pCluster,ptrdiff_t idx)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  ulong *puVar3;
  ulong uVar4;
  undefined8 *puVar5;
  long *plVar6;
  long lVar7;
  long *plVar8;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Cluster **qq_1;
  Cluster **q;
  Cluster **p;
  Cluster **pp;
  Cluster **p_1;
  Cluster **q_1;
  Cluster **qq;
  long n;
  long *size;
  long count;
  ulong local_80;
  long *local_68;
  undefined8 *local_50;
  undefined8 *local_48;
  bool local_1;
  
  if (((in_RSI == 0) || (-1 < *(long *)(in_RSI + 0x10))) || (in_RDX < *(long *)(in_RDI + 0xb0))) {
    local_1 = false;
  }
  else {
    lVar7 = *(long *)(in_RDI + 0xb0) + *(long *)(in_RDI + 0xb8);
    puVar3 = (ulong *)(in_RDI + 0xc0);
    if ((long)*puVar3 < lVar7) {
      local_1 = false;
    }
    else {
      if ((long)*puVar3 <= lVar7) {
        if ((long)*puVar3 < 1) {
          local_80 = 0x800;
        }
        else {
          local_80 = *puVar3 << 1;
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_80;
        uVar4 = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          uVar4 = 0xffffffffffffffff;
        }
        puVar5 = (undefined8 *)operator_new__(uVar4,(nothrow_t *)&std::nothrow);
        if (puVar5 == (undefined8 *)0x0) {
          return false;
        }
        puVar1 = *(undefined8 **)(in_RDI + 0xa8);
        local_50 = puVar1;
        local_48 = puVar5;
        while (local_50 != puVar1 + lVar7) {
          *local_48 = *local_50;
          local_50 = local_50 + 1;
          local_48 = local_48 + 1;
        }
        if (*(void **)(in_RDI + 0xa8) != (void *)0x0) {
          operator_delete__(*(void **)(in_RDI + 0xa8));
        }
        *(undefined8 **)(in_RDI + 0xa8) = puVar5;
        *puVar3 = local_80;
      }
      if (*(long *)(in_RDI + 0xa8) == 0) {
        local_1 = false;
      }
      else {
        plVar8 = (long *)(*(long *)(in_RDI + 0xa8) + in_RDX * 8);
        local_68 = (long *)(*(long *)(in_RDI + 0xa8) + lVar7 * 8);
        if ((local_68 < plVar8) || ((long *)(*(long *)(in_RDI + 0xa8) + *puVar3 * 8) <= local_68)) {
          local_1 = false;
        }
        else {
          while (plVar8 < local_68) {
            plVar6 = local_68 + -1;
            if (-1 < *(long *)(*plVar6 + 0x10)) {
              return false;
            }
            *local_68 = *plVar6;
            local_68 = plVar6;
          }
          *(long *)(*(long *)(in_RDI + 0xa8) + in_RDX * 8) = in_RSI;
          *(long *)(in_RDI + 0xb8) = *(long *)(in_RDI + 0xb8) + 1;
          local_1 = true;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool Segment::PreloadCluster(Cluster* pCluster, ptrdiff_t idx) {
  if (pCluster == NULL || pCluster->m_index >= 0 || idx < m_clusterCount)
    return false;

  const long count = m_clusterCount + m_clusterPreloadCount;

  long& size = m_clusterSize;
  if (size < count)
    return false;

  if (count >= size) {
    const long n = (size <= 0) ? 2048 : 2 * size;

    Cluster** const qq = new (std::nothrow) Cluster*[n];
    if (qq == NULL)
      return false;
    Cluster** q = qq;

    Cluster** p = m_clusters;
    Cluster** const pp = p + count;

    while (p != pp)
      *q++ = *p++;

    delete[] m_clusters;

    m_clusters = qq;
    size = n;
  }

  if (m_clusters == NULL)
    return false;

  Cluster** const p = m_clusters + idx;

  Cluster** q = m_clusters + count;
  if (q < p || q >= (m_clusters + size))
    return false;

  while (q > p) {
    Cluster** const qq = q - 1;

    if ((*qq)->m_index >= 0)
      return false;

    *q = *qq;
    q = qq;
  }

  m_clusters[idx] = pCluster;
  ++m_clusterPreloadCount;
  return true;
}